

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O3

shared_ptr<Bird> __thiscall
cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>::createInstance
          (InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_> *this,
          InjectionContext *context)

{
  pointer pcVar1;
  InjectionContext *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Bird> sVar2;
  ContextGuard guard;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  char local_58 [16];
  ContextGuard local_48;
  
  pcVar1 = context[1].componentStack_.
           super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_90 = local_80;
  if (pcVar1 == (pointer)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Snake","");
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,context[1].container_,
               (long)&(context[1].container_)->parentContainer_ + (long)pcVar1);
  }
  local_70 = (undefined1  [8])&Bird::typeinfo;
  local_68._M_p = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_90,local_90 + local_88);
  ContextGuard::ContextGuard(&local_48,in_RDX,(component_type *)local_70);
  if (local_68._M_p != local_58) {
    operator_delete(local_68._M_p);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  ContextGuard::ensureNoCycle(&local_48);
  ConstructorInvoker<Bird_(std::shared_ptr<Legs>,_std::shared_ptr<Wings>,_std::shared_ptr<Behavior>,_std::shared_ptr<WaterPool>)>
  ::invoke((ConstructorInvoker<Bird_(std::shared_ptr<Legs>,_std::shared_ptr<Wings>,_std::shared_ptr<Behavior>,_std::shared_ptr<WaterPool>)>
            *)this,in_RDX);
  ContextGuard::~ContextGuard(&local_48);
  sVar2.super___shared_ptr<Bird,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Bird,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Bird>)sVar2.super___shared_ptr<Bird,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TImplementation> createInstance(InjectionContext* context)
    {
        ContextGuard guard(context, make_component_type<TImplementation>(!name_.empty() ? name_ : type_name<TImplementation>::value()));

        guard.ensureNoCycle();

        return factory_.createInstance(context);
    }